

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.h
# Opt level: O0

internalJSONNode * __thiscall internalJSONNode::makeUnique(internalJSONNode *this)

{
  size_t sVar1;
  allocator local_49;
  json_string local_48;
  internalJSONNode *local_18;
  internalJSONNode *this_local;
  
  local_18 = this;
  if (this->refcount < 2) {
    sVar1 = this->refcount;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"makeUnique on a 0 refcount internal",&local_49);
    JSONDebug::_JSON_ASSERT(sVar1 == 1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local = this;
  }
  else {
    decRef(this);
    this_local = newInternal(this);
  }
  return this_local;
}

Assistant:

inline internalJSONNode * internalJSONNode::makeUnique(void) json_nothrow {
    #ifdef JSON_REF_COUNT
	   if (refcount > 1){
		  decRef();
		  return newInternal(*this);
	   }
	   JSON_ASSERT(refcount == 1, JSON_TEXT("makeUnique on a 0 refcount internal"));
	   return this;
    #else
	   return newInternal(*this);
    #endif
}